

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coll.cpp
# Opt level: O1

UObject * __thiscall
icu_63::ICUCollatorService::handleDefault
          (ICUCollatorService *this,ICUServiceKey *key,UnicodeString *actualID,UErrorCode *status)

{
  ushort uVar1;
  UObject *pUVar2;
  int iVar3;
  Locale loc;
  Locale LStack_f8;
  
  if (actualID != (UnicodeString *)0x0) {
    uVar1 = (actualID->fUnion).fStackFields.fLengthAndFlags;
    if ((uVar1 & 1) == 0) {
      if ((short)uVar1 < 0) {
        iVar3 = (actualID->fUnion).fFields.fLength;
      }
      else {
        iVar3 = (int)(short)uVar1 >> 5;
      }
      if (iVar3 != 0) {
        (actualID->fUnion).fStackFields.fLengthAndFlags = uVar1 & 0x1e;
      }
    }
    else {
      UnicodeString::unBogus(actualID);
    }
  }
  Locale::Locale(&LStack_f8,"",(char *)0x0,(char *)0x0,(char *)0x0);
  (*(key->super_UObject)._vptr_UObject[0xb])(key,&LStack_f8);
  pUVar2 = &Collator::makeInstance(&LStack_f8,status)->super_UObject;
  Locale::~Locale(&LStack_f8);
  return pUVar2;
}

Assistant:

virtual UObject* handleDefault(const ICUServiceKey& key, UnicodeString* actualID, UErrorCode& status) const {
        LocaleKey& lkey = (LocaleKey&)key;
        if (actualID) {
            // Ugly Hack Alert! We return an empty actualID to signal
            // to callers that this is a default object, not a "real"
            // service-created object. (TODO remove in 3.0) [aliu]
            actualID->truncate(0);
        }
        Locale loc("");
        lkey.canonicalLocale(loc);
        return Collator::makeInstance(loc, status);
    }